

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O0

bool vera::loadPLY(string *_filename,Mesh *_mesh)

{
  bool bVar1;
  value_type vVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  istream *piVar8;
  long lVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  size_type sVar14;
  ostream *poVar15;
  int local_7b4;
  value_type local_7b0;
  int local_7ac;
  int i;
  int numV;
  stringstream sline_1;
  value_type local_620;
  vec2 uv;
  undefined8 local_610;
  float local_608;
  float local_604;
  float a;
  float b;
  float g;
  float r;
  vec4 c;
  vec3 n;
  vec3 v;
  stringstream sline;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  undefined1 local_348 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  string name;
  int local_2a8;
  int lineNum;
  State state;
  uint uStack_29c;
  bool floatColor;
  int currentFace;
  int currentVertex;
  int normalsCoordsFound;
  int texCoordsFound;
  int colorCompsFound;
  int vertexCoordsFound;
  int orderIndices;
  int orderVertices;
  string error;
  string line;
  istream local_230 [8];
  fstream is;
  Mesh *_mesh_local;
  string *_filename_local;
  
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(local_230,pcVar7,_S_in);
  bVar4 = std::fstream::is_open();
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&orderIndices);
    vertexCoordsFound = -1;
    colorCompsFound = -1;
    texCoordsFound = 0;
    normalsCoordsFound = 0;
    currentVertex = 0;
    currentFace = 0;
    uStack_29c = 0;
    state = Header;
    bVar1 = false;
    local_2a8 = 0;
    std::__cxx11::string::string
              ((string *)
               &colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
              *)&vertices.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&normals.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&texcoord.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (local_230,(string *)(error.field_2._M_local_buf + 8));
    name.field_2._12_4_ = 1;
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&error.field_2 + 8),"ply");
    if (bVar5) {
      std::__cxx11::string::operator=((string *)&orderIndices,"wrong format, expecting \'ply\'");
LAB_0058db44:
      poVar15 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,name.field_2._12_4_);
      poVar15 = std::operator<<(poVar15,":");
      poVar15 = std::operator<<(poVar15,(string *)&orderIndices);
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      poVar15 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): \"");
      poVar15 = std::operator<<(poVar15,(string *)(error.field_2._M_local_buf + 8));
      poVar15 = std::operator<<(poVar15,"\"");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      local_7b4 = 0;
    }
    else {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_230,(string *)(error.field_2._M_local_buf + 8));
      name.field_2._12_4_ = 2;
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&error.field_2 + 8),"format ascii 1.0");
      iVar3 = 2;
      if (bVar5) {
        std::__cxx11::string::operator=
                  ((string *)&orderIndices,"wrong format, expecting \'format ascii 1.0\'");
        goto LAB_0058db44;
      }
      do {
        do {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              do {
                                name.field_2._12_4_ = iVar3;
                                piVar8 = std::
                                         getline<char,std::char_traits<char>,std::allocator<char>>
                                                   (local_230,
                                                    (string *)(error.field_2._M_local_buf + 8));
                                bVar5 = std::ios::operator_cast_to_bool
                                                  ((ios *)(piVar8 + *(long *)(*(long *)piVar8 +
                                                                             -0x18)));
                                if (!bVar5) {
                                  std::fstream::close();
                                  Mesh::addColors(_mesh,(
                                                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  *)&vertices.
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 );
                                  Mesh::addVertices(_mesh,(
                                                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  *)&normals.
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  Mesh::addTexCoords(_mesh,(
                                                  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                  *)&indices.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>
                                           ::size((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_348);
                                  if (sVar14 == 0) {
                                    Mesh::setDrawMode(_mesh,POINTS);
                                  }
                                  else {
                                    Mesh::addIndices(_mesh,(
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_348);
                                  }
                                  sVar14 = std::
                                           vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ::size((
                                                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  *)&texcoord.
                                                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 );
                                  if (sVar14 == 0) {
                                    Mesh::computeNormals(_mesh);
                                  }
                                  else {
                                    Mesh::addNormals(_mesh,(
                                                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  *)&texcoord.
                                                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  }
                                  Mesh::computeTangents(_mesh);
                                  _filename_local._7_1_ = 1;
                                  local_7b4 = 1;
                                  goto LAB_0058dc3b;
                                }
                                name.field_2._12_4_ = name.field_2._12_4_ + 1;
                                lVar9 = std::__cxx11::string::find
                                                  (error.field_2._M_local_buf + 8,0x60f40a);
                                iVar3 = name.field_2._12_4_;
                              } while (lVar9 == 0);
                              if (((local_2a8 != 0) && (local_2a8 != 2)) ||
                                 (lVar9 = std::__cxx11::string::find
                                                    (error.field_2._M_local_buf + 8,0x60f412),
                                 lVar9 != 0)) break;
                              local_2a8 = 1;
                              iVar6 = glm::max<int>(colorCompsFound,0);
                              vertexCoordsFound = iVar6 + 1;
                              std::__cxx11::string::substr
                                        ((ulong)&local_368,(ulong)((long)&error.field_2 + 8));
                              iVar6 = toInt(&local_368);
                              std::
                              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ::resize((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        *)&normals.
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)iVar6);
                              std::__cxx11::string::~string((string *)&local_368);
                            }
                            if (((local_2a8 != 0) && (local_2a8 != 1)) ||
                               (lVar9 = std::__cxx11::string::find
                                                  (error.field_2._M_local_buf + 8,0x60f421),
                               lVar9 != 0)) break;
                            local_2a8 = 2;
                            iVar6 = glm::max<int>(vertexCoordsFound,0);
                            colorCompsFound = iVar6 + 1;
                            std::__cxx11::string::substr
                                      ((ulong)&local_388,(ulong)((long)&error.field_2 + 8));
                            iVar6 = toInt(&local_388);
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       local_348,(long)(iVar6 * 3));
                            std::__cxx11::string::~string((string *)&local_388);
                          }
                          if ((local_2a8 != 1) ||
                             (((lVar9 = std::__cxx11::string::find
                                                  (error.field_2._M_local_buf + 8,0x60f42e),
                               lVar9 != 0 &&
                               (lVar9 = std::__cxx11::string::find
                                                  (error.field_2._M_local_buf + 8,0x60f43f),
                               lVar9 != 0)) &&
                              (lVar9 = std::__cxx11::string::find
                                                 (error.field_2._M_local_buf + 8,0x60f450),
                              lVar9 != 0)))) break;
                          texCoordsFound = texCoordsFound + 1;
                        }
                        if ((local_2a8 != 1) ||
                           (((lVar9 = std::__cxx11::string::find
                                                (error.field_2._M_local_buf + 8,0x60f461),
                             lVar9 != 0 &&
                             (lVar9 = std::__cxx11::string::find
                                                (error.field_2._M_local_buf + 8,0x60f473),
                             lVar9 != 0)) &&
                            (lVar9 = std::__cxx11::string::find
                                               (error.field_2._M_local_buf + 8,0x60f485), lVar9 != 0
                            )))) break;
                        currentFace = currentFace + 1;
                        if (currentFace == 3) {
                          sVar14 = std::
                                   vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           *)&normals.
                                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          std::
                          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ::resize((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    *)&texcoord.
                                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar14);
                        }
                      }
                      if ((local_2a8 != 1) ||
                         (((lVar9 = std::__cxx11::string::find
                                              (error.field_2._M_local_buf + 8,0x60f497), lVar9 != 0
                           && (lVar9 = std::__cxx11::string::find
                                                 (error.field_2._M_local_buf + 8,0x60f4a8),
                              lVar9 != 0)) &&
                          ((lVar9 = std::__cxx11::string::find
                                              (error.field_2._M_local_buf + 8,0x60f4b9), lVar9 != 0
                           && (lVar9 = std::__cxx11::string::find
                                                 (error.field_2._M_local_buf + 8,0x60f4ca),
                              lVar9 != 0)))))) break;
                      normalsCoordsFound = normalsCoordsFound + 1;
                      sVar14 = std::
                               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       *)&normals.
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      std::
                      vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                      ::resize((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                *)&vertices.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar14);
                      bVar1 = true;
                    }
                    if ((local_2a8 != 1) ||
                       (((lVar9 = std::__cxx11::string::find
                                            (error.field_2._M_local_buf + 8,0x60f4db), lVar9 != 0 &&
                         (lVar9 = std::__cxx11::string::find
                                            (error.field_2._M_local_buf + 8,0x60f4ee), lVar9 != 0))
                        && ((lVar9 = std::__cxx11::string::find
                                               (error.field_2._M_local_buf + 8,0x60f503), lVar9 != 0
                            && (lVar9 = std::__cxx11::string::find
                                                  (error.field_2._M_local_buf + 8,0x60f517),
                               lVar9 != 0)))))) break;
                    normalsCoordsFound = normalsCoordsFound + 1;
                    sVar14 = std::
                             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     *)&normals.
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                    ::resize((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                              *)&vertices.
                                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar14);
                    bVar1 = false;
                  }
                  if ((local_2a8 != 1) ||
                     ((lVar9 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f52c),
                      lVar9 != 0 &&
                      (lVar9 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f53d),
                      lVar9 != 0)))) break;
                  currentVertex = currentVertex + 1;
                  sVar14 = std::
                           vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   *)&normals.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ::resize((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                            *)&indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,sVar14);
                }
                if ((local_2a8 != 1) ||
                   ((lVar9 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f54e),
                    lVar9 != 0 &&
                    (lVar9 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f567),
                    lVar9 != 0)))) break;
                currentVertex = currentVertex + 1;
                sVar14 = std::
                         vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 *)&normals.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ::resize((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar14);
              }
              if (((local_2a8 == 2) &&
                  (lVar9 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f580),
                  lVar9 != 0)) &&
                 (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&error.field_2 + 8),"end_header"), bVar5)) {
                std::__cxx11::string::operator=((string *)&orderIndices,"wrong face definition");
                goto LAB_0058db44;
              }
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&error.field_2 + 8),"end_header");
              if (!bVar5) break;
              sVar14 = std::
                       vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                       ::size((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                               *)&vertices.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (((sVar14 != 0) && (normalsCoordsFound != 3)) && (normalsCoordsFound != 4)) {
                toString<int>(&local_3e8,&normalsCoordsFound);
                std::operator+(&local_3c8,
                               "data has color coordiantes but not correct number of components. Found "
                               ,&local_3e8);
                std::operator+(&local_3a8,&local_3c8," expecting 3 or 4");
                std::__cxx11::string::operator=((string *)&orderIndices,(string *)&local_3a8);
                std::__cxx11::string::~string((string *)&local_3a8);
                std::__cxx11::string::~string((string *)&local_3c8);
                std::__cxx11::string::~string((string *)&local_3e8);
                goto LAB_0058db44;
              }
              sVar14 = std::
                       vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               *)&texcoord.
                                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((sVar14 != 0) && (currentFace != 3)) {
                toString<int>(&local_448,&currentFace);
                std::operator+(&local_428,
                               "data has normal coordiantes but not correct number of components. Found "
                               ,&local_448);
                std::operator+(&local_408,&local_428," expecting 3");
                std::__cxx11::string::operator=((string *)&orderIndices,(string *)&local_408);
                std::__cxx11::string::~string((string *)&local_408);
                std::__cxx11::string::~string((string *)&local_428);
                std::__cxx11::string::~string((string *)&local_448);
                goto LAB_0058db44;
              }
              sVar14 = std::
                       vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               *)&normals.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (sVar14 == 0) {
                poVar15 = std::operator<<((ostream *)&std::cout,
                                          "ERROR glMesh, load(): mesh loaded from \"");
                poVar15 = std::operator<<(poVar15,(string *)_filename);
                poVar15 = std::operator<<(poVar15,"\" has no vertices");
                std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
              }
              if (vertexCoordsFound == -1) {
                vertexCoordsFound = 9999;
              }
              if (colorCompsFound == -1) {
                colorCompsFound = 9999;
              }
              if (vertexCoordsFound < colorCompsFound) {
                local_2a8 = 3;
              }
              else {
                local_2a8 = 5;
              }
            }
            if (local_2a8 != 3) break;
            std::__cxx11::stringstream::stringstream((stringstream *)&v.field_1);
            std::__cxx11::stringstream::str((string *)&v.field_1);
            std::istream::operator>>(&v.field_1,&n.field_1.y);
            std::istream::operator>>(&v.field_1,&n.field_2.z);
            if (2 < texCoordsFound) {
              std::istream::operator>>(&v.field_1,(float *)&v);
            }
            pvVar10 = std::
                      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    *)&normals.
                                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)(int)uStack_29c);
            pvVar10->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)n.field_1;
            pvVar10->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)n.field_2;
            pvVar10->field_2 =
                 (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)v.field_0;
            if (0 < currentFace) {
              std::istream::operator>>(&v.field_1,&c.field_2.z);
              std::istream::operator>>(&v.field_1,&c.field_3.w);
              std::istream::operator>>(&v.field_1,(float *)&n);
              pvVar10 = std::
                        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      *)&texcoord.
                                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)(int)uStack_29c);
              pvVar10->field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)c.field_2;
              pvVar10->field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)c.field_3;
              pvVar10->field_2 =
                   (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)n.field_0;
            }
            if (0 < normalsCoordsFound) {
              if (bVar1) {
                std::istream::operator>>(&v.field_1,&g);
                std::istream::operator>>(&v.field_1,&r);
                std::istream::operator>>(&v.field_1,(float *)&c);
                if (3 < normalsCoordsFound) {
                  std::istream::operator>>(&v.field_1,&c.field_1.y);
                }
                pvVar11 = std::
                          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                          ::operator[]((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                        *)&vertices.
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)(int)uStack_29c);
                pvVar11->field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)g
                ;
                pvVar11->field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)r
                ;
                pvVar11->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)c.field_0;
                pvVar11->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)c.field_1;
              }
              else {
                local_608 = 255.0;
                std::istream::operator>>(&v.field_1,&b);
                std::istream::operator>>(&v.field_1,&a);
                std::istream::operator>>(&v.field_1,&local_604);
                if (3 < normalsCoordsFound) {
                  std::istream::operator>>(&v.field_1,&local_608);
                }
                glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
                          ((vec<4,float,(glm::qualifier)0> *)&uv,(double)b / 255.0,(double)a / 255.0
                           ,(double)local_604 / 255.0,(double)local_608 / 255.0);
                pvVar11 = std::
                          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                          ::operator[]((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                        *)&vertices.
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)(int)uStack_29c);
                pvVar11->field_0 =
                     (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)uv.field_0;
                pvVar11->field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uv.field_1;
                pvVar11->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
                     (undefined4)local_610;
                pvVar11->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_610._4_4_
                ;
              }
            }
            if (0 < currentVertex) {
              std::istream::operator>>(&v.field_1,(float *)&local_620);
              std::istream::operator>>(&v.field_1,&local_620.field_1.y);
              pvVar12 = std::
                        vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                      *)&indices.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)(int)uStack_29c);
              *pvVar12 = local_620;
            }
            uStack_29c = uStack_29c + 1;
            sVar14 = std::
                     vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)&normals.
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (uStack_29c == sVar14) {
              if (vertexCoordsFound < colorCompsFound) {
                local_2a8 = 5;
              }
              else {
                local_2a8 = 3;
              }
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&v.field_1);
          }
        } while ((local_2a8 != 5) ||
                (sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_348), sVar14 == 0));
        std::__cxx11::stringstream::stringstream((stringstream *)&i);
        std::__cxx11::stringstream::str((string *)&i);
        std::istream::operator>>(&i,&local_7ac);
        if (local_7ac == 3) {
          std::istream::operator>>(&i,(int *)&local_7b0);
          vVar2 = local_7b0;
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348,
                               (long)(int)(state * 3));
          *pvVar13 = vVar2;
          std::istream::operator>>(&i,(int *)&local_7b0);
          vVar2 = local_7b0;
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348,
                               (long)(int)(state * 3 + 1));
          *pvVar13 = vVar2;
          std::istream::operator>>(&i,(int *)&local_7b0);
          vVar2 = local_7b0;
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348,
                               (long)(int)(state * 3 + 2));
          *pvVar13 = vVar2;
          state = state + VertexDef;
          sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348);
          if ((ulong)state == sVar14 / 3) {
            if (vertexCoordsFound < colorCompsFound) {
              local_2a8 = 3;
            }
            else {
              local_2a8 = 5;
            }
          }
          local_7b4 = 3;
        }
        else {
          std::__cxx11::string::operator=((string *)&orderIndices,"face not a triangle");
          local_7b4 = 2;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&i);
        if (local_7b4 == 2) goto LAB_0058db44;
      } while (local_7b4 == 3);
    }
LAB_0058dc3b:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_348);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&texcoord.
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&normals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               *)&vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&orderIndices);
    std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
    if (local_7b4 != 0) goto LAB_0058dd78;
  }
  std::fstream::close();
  poVar15 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, can not load  ");
  poVar15 = std::operator<<(poVar15,(string *)_filename);
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  _filename_local._7_1_ = 0;
LAB_0058dd78:
  std::fstream::~fstream(local_230);
  return (bool)(_filename_local._7_1_ & 1);
}

Assistant:

bool loadPLY( const std::string& _filename, Mesh& _mesh ) {
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {
        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        _mesh.addColors(colors);
        _mesh.addVertices(vertices);
        _mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 )
            _mesh.addIndices( indices );
        else 
            _mesh.setDrawMode( POINTS );
        
        if ( normals.size() > 0 )
            _mesh.addNormals( normals );
        else
            _mesh.computeNormals();

        _mesh.computeTangents();
        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}